

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_predictor_8x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *dst_00;
  longlong local_158 [16];
  __m128i ww [2];
  __m128i pixels [8];
  
  load_pixel_w8(above,left,0x20,pixels);
  ww[0][0] = 0x3b00c5000100ff;
  ww[0][1] = 0x970069006e0092;
  ww[1][0] = 0xce003200b70049;
  ww[1][1] = 0xe0002000db0025;
  local_158[0] = 0xd200e100f000ff;
  local_158[1] = 0x9d00a900b600c4;
  local_158[2] = 0x2e001f00100001;
  local_158[3] = 0x630057004a003c;
  local_158[4] = 0x6f007a00850091;
  local_158[5] = 0x4a0053005c0065;
  local_158[6] = 0x910086007b006f;
  local_158[7] = 0xb600ad00a4009b;
  local_158[8] = 0x2d0034003b0042;
  local_158[9] = 0x19001d00220027;
  local_158[10] = 0xd300cc00c500be;
  local_158[0xb] = 0xe700e300de00d9;
  local_158[0xc] = 0xc000e00110015;
  local_158[0xd] = 0x800080009000a;
  local_158[0xe] = 0xf400f200ef00eb;
  local_158[0xf] = 0xf800f800f700f6;
  smooth_pred_8xh(pixels,(__m128i *)local_158,ww,8,dst,stride,0);
  dst_00 = dst + stride * 8;
  smooth_pred_8xh(pixels,(__m128i *)(local_158 + 4),ww,8,dst_00,stride,1);
  smooth_pred_8xh(pixels + 4,(__m128i *)(local_158 + 8),ww,8,dst_00 + stride * 8,stride,0);
  smooth_pred_8xh(pixels + 4,(__m128i *)(local_158 + 0xc),ww,8,dst_00 + stride * 8 + stride * 8,
                  stride,1);
  return;
}

Assistant:

void aom_smooth_predictor_8x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i pixels[8];
  load_pixel_w8(above, left, 32, pixels);

  __m128i wh[8], ww[2];
  load_weight_w8(32, wh, ww);

  smooth_pred_8xh(&pixels[0], wh, ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_8xh(&pixels[0], &wh[2], ww, 8, dst, stride, 1);
  dst += stride << 3;
  smooth_pred_8xh(&pixels[4], &wh[4], ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_8xh(&pixels[4], &wh[6], ww, 8, dst, stride, 1);
}